

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void * JS_GetOpaque(JSValue obj,JSClassID class_id)

{
  if (((int)obj.tag == -1) && (*(ushort *)((long)obj.u.ptr + 6) == class_id)) {
    return *(void **)((long)obj.u.ptr + 0x30);
  }
  return (void *)0x0;
}

Assistant:

void *JS_GetOpaque(JSValueConst obj, JSClassID class_id)
{
    JSObject *p;
    if (JS_VALUE_GET_TAG(obj) != JS_TAG_OBJECT)
        return NULL;
    p = JS_VALUE_GET_OBJ(obj);
    if (p->class_id != class_id)
        return NULL;
    return p->u.opaque;
}